

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DTDScanner::scanEntityDef(DTDScanner *this,DTDEntityDecl *decl,bool isPEDecl)

{
  XMLBufferMgr *pXVar1;
  XMLBufferMgr *this_00;
  XMLCh *pXVar2;
  bool bVar3;
  bool bVar4;
  XMLCh XVar5;
  XMLBuffer *pXVar6;
  XMLCh *newId;
  XMLCh *pXVar7;
  LastExtEntityInfo *this_01;
  XMLBufBid bbPubId;
  XMLBufBid bbSysId;
  XMLBufBid bbName;
  LastExtEntityInfo lastInfo;
  
  XVar5 = ReaderMgr::peekNextChar(this->fReaderMgr);
  if (XVar5 != L'\'') {
    XVar5 = ReaderMgr::peekNextChar(this->fReaderMgr);
    if (XVar5 != L'\"') {
      pXVar1 = this->fBufMgr;
      bbPubId.fBuffer = XMLBufferMgr::bidOnBuffer(pXVar1);
      this_00 = this->fBufMgr;
      bbPubId.fMgr = pXVar1;
      bbSysId.fBuffer = XMLBufferMgr::bidOnBuffer(this_00);
      bbSysId.fMgr = this_00;
      bVar3 = scanId(this,bbPubId.fBuffer,bbSysId.fBuffer,IDType_External);
      if (bVar3) {
        (decl->super_XMLEntityDecl).fIsExternal = true;
        ReaderMgr::getLastExtEntityInfo(this->fReaderMgr,&lastInfo);
        pXVar7 = (bbPubId.fBuffer)->fBuffer;
        pXVar7[(bbPubId.fBuffer)->fIndex] = L'\0';
        pXVar2 = (bbSysId.fBuffer)->fBuffer;
        pXVar2[(bbSysId.fBuffer)->fIndex] = L'\0';
        newId = (XMLCh *)0x0;
        if (*pXVar7 != L'\0') {
          newId = pXVar7;
        }
        XMLEntityDecl::setPublicId(&decl->super_XMLEntityDecl,newId);
        pXVar7 = (XMLCh *)0x0;
        if (*pXVar2 != L'\0') {
          pXVar7 = pXVar2;
        }
        XMLEntityDecl::setSystemId(&decl->super_XMLEntityDecl,pXVar7);
        pXVar7 = (XMLCh *)0x0;
        if ((lastInfo.systemId != (XMLCh *)0x0) && (*lastInfo.systemId != L'\0')) {
          pXVar7 = lastInfo.systemId;
        }
        XMLEntityDecl::setBaseURI(&decl->super_XMLEntityDecl,pXVar7);
        bVar4 = checkForPERef(this,false,true);
        if (isPEDecl) {
          bVar3 = true;
          if (!bVar4) goto LAB_002fa455;
          bVar3 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgNDATAString);
          if (bVar3) {
            XMLScanner::emitError(this->fScanner,NDATANotValidForPE);
          }
        }
        XVar5 = ReaderMgr::peekNextChar(this->fReaderMgr);
        bVar3 = true;
        if (XVar5 != L'>') {
          if (!bVar4) {
            XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
          }
          bVar3 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgNDATAString);
          if (!bVar3) {
            XMLScanner::emitError(this->fScanner,ExpectedNDATA);
          }
          bVar3 = checkForPERef(this,false,true);
          if (!bVar3) {
            XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
          }
          pXVar1 = this->fBufMgr;
          pXVar6 = XMLBufferMgr::bidOnBuffer(pXVar1);
          bbName.fBuffer = pXVar6;
          bbName.fMgr = pXVar1;
          bVar3 = ReaderMgr::getName(this->fReaderMgr,pXVar6);
          if (bVar3) {
            pXVar7 = pXVar6->fBuffer;
            pXVar7[pXVar6->fIndex] = L'\0';
            XMLEntityDecl::setNotationName(&decl->super_XMLEntityDecl,pXVar7);
          }
          else {
            XMLScanner::emitError(this->fScanner,ExpectedNotationName);
          }
          XMLBufBid::~XMLBufBid(&bbName);
        }
      }
      else {
        bVar3 = false;
      }
LAB_002fa455:
      this_01 = (LastExtEntityInfo *)&bbPubId;
      XMLBufBid::~XMLBufBid(&bbSysId);
      goto LAB_002fa462;
    }
  }
  pXVar1 = this->fBufMgr;
  pXVar6 = XMLBufferMgr::bidOnBuffer(pXVar1);
  lastInfo.systemId = (XMLCh *)pXVar6;
  lastInfo.publicId = (XMLCh *)pXVar1;
  bVar3 = scanEntityLiteral(this,pXVar6);
  if (bVar3) {
    pXVar7 = pXVar6->fBuffer;
    pXVar7[pXVar6->fIndex] = L'\0';
    XMLEntityDecl::setValue(&decl->super_XMLEntityDecl,pXVar7);
  }
  this_01 = &lastInfo;
LAB_002fa462:
  XMLBufBid::~XMLBufBid((XMLBufBid *)this_01);
  return bVar3;
}

Assistant:

bool DTDScanner::scanEntityDef(DTDEntityDecl& decl, const bool isPEDecl)
{
    // Its got to be an entity literal
    if (fReaderMgr->lookingAtChar(chSingleQuote)
    ||  fReaderMgr->lookingAtChar(chDoubleQuote))
    {
        // Get a buffer for the literal
        XMLBufBid bbValue(fBufMgr);

        if (!scanEntityLiteral(bbValue.getBuffer()))
            return false;

        // Set it on the entity decl
        decl.setValue(bbValue.getRawBuffer());
        return true;
    }

    //
    //  Its got to be an external entity, so there must be an external id.
    //  Get buffers for them and scan an external id into them.
    //
    XMLBufBid bbPubId(fBufMgr);
    XMLBufBid bbSysId(fBufMgr);
    if (!scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), IDType_External))
        return false;

    decl.setIsExternal(true);
    ReaderMgr::LastExtEntityInfo lastInfo;
    fReaderMgr->getLastExtEntityInfo(lastInfo);

    // Fill in the id fields of the decl with the info we got
    const XMLCh* publicId = bbPubId.getRawBuffer();
    const XMLCh* systemId = bbSysId.getRawBuffer();
    decl.setPublicId((publicId && *publicId) ? publicId : 0);
    decl.setSystemId((systemId && *systemId) ? systemId : 0);
    decl.setBaseURI((lastInfo.systemId && *lastInfo.systemId) ? lastInfo.systemId : 0);

    // If its a PE decl, we are done
    bool gotSpaces = checkForPERef(false, true);
    if (isPEDecl)
    {
        //
        //  Check for a common error here. NDATA is not allowed for PEs
        //  so check for the NDATA string. If found give a nice meaningful
        //  error and continue parsing to eat the NDATA text.
        //
        if (gotSpaces)
        {
            if (fReaderMgr->skippedString(XMLUni::fgNDATAString))
                fScanner->emitError(XMLErrs::NDATANotValidForPE);
        }
         else
        {
            return true;
        }
    }

    // If looking at close angle now, we are done
    if (fReaderMgr->lookingAtChar(chCloseAngle))
        return true;

    // Else we had to have seem the whitespace
    if (!gotSpaces)
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // We now have to see a notation data string
    if (!fReaderMgr->skippedString(XMLUni::fgNDATAString))
        fScanner->emitError(XMLErrs::ExpectedNDATA);

    // Space is required here, but try to go on if not
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // Get a name
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedNotationName);
        return false;
    }

    // Set the decl's notation name
    decl.setNotationName(bbName.getRawBuffer());

    return true;
}